

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

uint64_t get_psw_mask(CPUS390XState_conflict *env)

{
  ulong uVar1;
  uint32_t uVar2;
  uint64_t r;
  CPUS390XState_conflict *env_local;
  
  uVar1 = (env->psw).mask;
  uVar2 = calc_cc(env,env->cc_op,env->cc_src,env->cc_dst,env->cc_vr);
  env->cc_op = uVar2;
  if ((env->cc_op & 0xfffffffc) == 0) {
    return (ulong)env->cc_op << 0x2c | uVar1 & 0xffffcfffffffffff;
  }
  __assert_fail("!(env->cc_op & ~3)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/helper.c"
                ,0x7f,"uint64_t get_psw_mask(CPUS390XState *)");
}

Assistant:

uint64_t get_psw_mask(CPUS390XState *env)
{
    uint64_t r = env->psw.mask;

    env->cc_op = calc_cc(env, env->cc_op, env->cc_src, env->cc_dst,
            env->cc_vr);

    r &= ~PSW_MASK_CC;
    assert(!(env->cc_op & ~3));
    r |= (uint64_t)env->cc_op << 44;

    return r;
}